

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall sfc::Palette::check_col0_duplicates(Palette *this)

{
  string_view fmt;
  bool bVar1;
  bool bVar2;
  reference this_00;
  Subpalette *sp;
  iterator __end2;
  iterator __begin2;
  vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *__range2;
  bool fixed;
  Palette *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_88;
  size_t local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_78 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  size_t sStack_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  Palette **local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  undefined8 local_20;
  Palette **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  bVar1 = col0_is_shared_for_mode(this->_mode);
  if (bVar1) {
    bVar1 = false;
    __end2 = std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::begin
                       (&this->_subpalettes);
    sp = (Subpalette *)
         std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::end(&this->_subpalettes);
    while (bVar2 = __gnu_cxx::
                   operator==<sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                             (&__end2,(__normal_iterator<sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                                       *)&sp), ((bVar2 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                ::operator*(&__end2);
      bVar2 = Subpalette::check_col0_duplicates(this_00);
      bVar1 = bVar1 || bVar2;
      __gnu_cxx::
      __normal_iterator<sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
      ::operator++(&__end2);
    }
    if (bVar1) {
      vargs = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
              anon_var_dwarf_10c5d5;
      sStack_58 = 0x4e;
      local_78[0] = ::fmt::v10::
                    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_68 = local_78;
      local_50 = &vargs;
      local_88 = vargs;
      local_80 = sStack_58;
      local_30 = &this_local;
      local_20 = 0;
      this_local = (Palette *)0x0;
      local_90 = local_68;
      fmt.size_ = sStack_58;
      fmt.data_ = (char *)vargs;
      local_48 = local_88;
      sStack_40 = local_80;
      local_38 = local_68;
      local_28 = local_68;
      local_18 = local_30;
      local_10 = local_68;
      ::fmt::v10::vprint(fmt,_this_local);
    }
  }
  return;
}

Assistant:

void Palette::check_col0_duplicates() {
  if (sfc::col0_is_shared_for_mode(_mode)) {
    bool fixed = false;
    for (auto& sp : _subpalettes)
      fixed |= sp.check_col0_duplicates();
    if (fixed)
      fmt::print("Palette contains duplicates of color zero, treating color zero as transparent\n");
  }
}